

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O2

void __thiscall
BamTools::Variant::
Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Impl
          (Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  (this->super_ImplBase)._vptr_ImplBase = (_func_int **)&PTR__Impl_001f1da0;
  std::__cxx11::string::~string((string *)&this->data);
  return;
}

Assistant:

~Impl() {}